

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

bool __thiscall cmCTestBZR::UpdateParser::ProcessChunk(UpdateParser *this,char *first,int length)

{
  char *__s;
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  
  if (length != 0) {
    bVar2 = *first == '\n' || *first == '\r';
    lVar6 = 0;
    do {
      if ((first[lVar6] == '\r') || (first[lVar6] == '\n')) {
        bVar1 = !bVar2;
        bVar2 = true;
        if (bVar1) {
          poVar5 = (this->super_LineParser).Log;
          if ((poVar5 != (ostream *)0x0) &&
             (__s = (this->super_LineParser).Prefix, __s != (char *)0x0)) {
            sVar4 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar4);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(this->super_LineParser).Line._M_dataplus._M_p,
                                (this->super_LineParser).Line._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          }
          iVar3 = (*(this->super_LineParser).super_OutputParser._vptr_OutputParser[3])(this);
          (this->super_LineParser).Line._M_string_length = 0;
          *(this->super_LineParser).Line._M_dataplus._M_p = '\0';
          if ((char)iVar3 == '\0') {
            return false;
          }
        }
      }
      else {
        bVar2 = false;
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&(this->super_LineParser).Line,
                   (this->super_LineParser).Line._M_string_length,0,'\x01');
      }
      lVar6 = lVar6 + 1;
    } while (length != lVar6);
  }
  return true;
}

Assistant:

bool ProcessChunk(const char* first, int length) override
  {
    bool last_is_new_line = (*first == '\r' || *first == '\n');

    const char* const last = first + length;
    for (const char* c = first; c != last; ++c) {
      if (*c == '\r' || *c == '\n') {
        if (!last_is_new_line) {
          // Log this line.
          if (this->Log && this->Prefix) {
            *this->Log << this->Prefix << this->Line << "\n";
          }

          // Hand this line to the subclass implementation.
          if (!this->ProcessLine()) {
            this->Line.clear();
            return false;
          }

          this->Line.clear();
          last_is_new_line = true;
        }
      } else {
        // Append this character to the line under construction.
        this->Line.append(1, *c);
        last_is_new_line = false;
      }
    }
    return true;
  }